

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddFocusEvent(ImGuiIO *this,bool focused)

{
  ImGuiInputEvent local_18;
  
  local_18.AddedByTestEngine = false;
  local_18._21_3_ = 0;
  local_18.field_2._4_8_ = 0;
  local_18.Type = ImGuiInputEventType_Focus;
  local_18._4_8_ = (ulong)focused << 0x20;
  ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
  return;
}

Assistant:

void ImGuiIO::AddFocusEvent(bool focused)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Focus;
    e.AppFocused.Focused = focused;
    g.InputEventsQueue.push_back(e);
}